

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_bigint.h
# Opt level: O3

void __thiscall
absl::lts_20250127::strings_internal::BigUnsigned<84>::MultiplyByTenToTheNth
          (BigUnsigned<84> *this,int n)

{
  if (9 < n) {
    MultiplyByFiveToTheNth(this,n);
    ShiftLeft(this,n);
    return;
  }
  if (0 < n) {
    MultiplyBy(this,(&kTenToNth)[(uint)n]);
    return;
  }
  return;
}

Assistant:

void MultiplyByTenToTheNth(int n) {
    if (n > kMaxSmallPowerOfTen) {
      // For large n, raise to a power of 5, then shift left by the same amount.
      // (10**n == 5**n * 2**n.)  This requires fewer multiplications overall.
      MultiplyByFiveToTheNth(n);
      ShiftLeft(n);
    } else if (n > 0) {
      // We can do this more quickly for very small N by using a single
      // multiplication.
      MultiplyBy(kTenToNth[n]);
    }
  }